

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

CURLcode recvbuf_write_hds(Curl_cfilter *cf,Curl_easy *data,char *buf,size_t blen)

{
  ssize_t sVar1;
  void *local_50;
  CURLcode local_44 [2];
  CURLcode result;
  ssize_t nwritten;
  stream_ctx *stream;
  size_t blen_local;
  char *buf_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  if ((data == (Curl_easy *)0x0) || ((data->req).p.file == (FILEPROTO *)0x0)) {
    local_50 = (void *)0x0;
  }
  else {
    local_50 = (((data->req).p.rtsp)->http_wrapper).h2_ctx;
  }
  nwritten = (ssize_t)local_50;
  stream = (stream_ctx *)blen;
  blen_local = (size_t)buf;
  buf_local = (char *)data;
  data_local = (Curl_easy *)cf;
  sVar1 = Curl_bufq_write((bufq *)((long)local_50 + 8),(uchar *)buf,blen,local_44);
  if (sVar1 < 0) {
    cf_local._4_4_ = local_44[0];
  }
  else {
    *(ssize_t *)(nwritten + 0x110) = sVar1 + *(long *)(nwritten + 0x110);
    cf_local._4_4_ = CURLE_OK;
  }
  return cf_local._4_4_;
}

Assistant:

static CURLcode recvbuf_write_hds(struct Curl_cfilter *cf,
                                  struct Curl_easy *data,
                                  const char *buf, size_t blen)
{
  struct stream_ctx *stream = H2_STREAM_CTX(data);
  ssize_t nwritten;
  CURLcode result;

  (void)cf;
  nwritten = Curl_bufq_write(&stream->recvbuf,
                             (const unsigned char *)buf, blen, &result);
  if(nwritten < 0)
    return result;
  stream->resp_hds_len += (size_t)nwritten;
  DEBUGASSERT((size_t)nwritten == blen);
  return CURLE_OK;
}